

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

int __thiscall SQLite::Statement::tryReset(Statement *this)

{
  int iVar1;
  
  this->mbHasRow = false;
  this->mbDone = false;
  iVar1 = sqlite3_reset((this->mStmtPtr).mpStmt);
  return iVar1;
}

Assistant:

int Statement::tryReset() noexcept
{
    mbHasRow = false;
    mbDone = false;
    return sqlite3_reset(mStmtPtr);
}